

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O0

void testCopyDeepScanLine(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  undefined8 in_RDI;
  string *unaff_retaddr;
  exception *e;
  int numThreads;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  random_reseed(0);
  IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::numThreads();
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_858cb::readCopyWriteTest
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  anon_unknown.dwarf_858cb::readCopyWriteTest
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  anon_unknown.dwarf_858cb::readCopyWriteTest
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  iVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void testCopyDeepScanLine (const std::string &tempDir)
{
    try
    {
        cout << "\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        
        readCopyWriteTest (tempDir,  1, 100);
        readCopyWriteTest (tempDir,  3,  50);
        readCopyWriteTest (tempDir, 10,  10);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}